

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigMan.c
# Opt level: O3

void Fraig_ManCreateSolver(Fraig_Man_t *p)

{
  Msat_Solver_t *p_00;
  Msat_IntVec_t *pMVar1;
  Msat_ClauseVec_t *pMVar2;
  
  if (p->pSat == (Msat_Solver_t *)0x0) {
    p_00 = Msat_SolverAlloc(500,1.0,1.0,1.0,1.0,0);
    p->pSat = p_00;
    pMVar1 = Msat_SolverReadConeVars(p_00);
    p->vVarsInt = pMVar1;
    pMVar2 = Msat_SolverReadAdjacents(p->pSat);
    p->vAdjacents = pMVar2;
    pMVar1 = Msat_SolverReadVarsUsed(p->pSat);
    p->vVarsUsed = pMVar1;
    timeSelect = 0;
    timeAssign = 0;
    return;
  }
  __assert_fail("p->pSat == NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fraig/fraigMan.c"
                ,0x149,"void Fraig_ManCreateSolver(Fraig_Man_t *)");
}

Assistant:

void Fraig_ManCreateSolver( Fraig_Man_t * p )
{
    extern abctime timeSelect;
    extern abctime timeAssign;
    assert( p->pSat == NULL );
    // allocate data for SAT solving
    p->pSat       = Msat_SolverAlloc( 500, 1, 1, 1, 1, 0 );
    p->vVarsInt   = Msat_SolverReadConeVars( p->pSat );   
    p->vAdjacents = Msat_SolverReadAdjacents( p->pSat );
    p->vVarsUsed  = Msat_SolverReadVarsUsed( p->pSat );
    timeSelect = 0;
    timeAssign = 0;
}